

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (nextarg == (char *)0x0) {
    return;
  }
  sVar3 = strlen(nextarg);
  if (sVar3 == 0) {
LAB_0011264a:
    pcVar4 = (char *)0x0;
  }
  else {
    iVar2 = curl_strnequal(nextarg,"pkcs11:",7);
    if ((iVar2 == 0) && (pcVar4 = strpbrk(nextarg,":\\"), pcVar4 != (char *)0x0)) {
      pcVar4 = (char *)malloc(sVar3 + 1);
      if (pcVar4 != (char *)0x0) {
        pcVar7 = pcVar4;
        if (*nextarg == '\0') {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = (char *)0x0;
          do {
            sVar3 = strcspn(nextarg,":\\");
            memcpy(pcVar7,nextarg,sVar3);
            pcVar1 = nextarg + sVar3;
            pcVar7 = pcVar7 + sVar3;
            cVar6 = nextarg[sVar3];
            if (cVar6 == '\\') {
              cVar6 = pcVar1[1];
              pcVar8 = pcVar7 + 1;
              if (cVar6 == ':') {
                *pcVar7 = ':';
              }
              else if (cVar6 == '\\') {
                *pcVar7 = '\\';
              }
              else {
                if (cVar6 == '\0') {
                  *pcVar7 = '\\';
                  pcVar5 = (char *)0x0;
                  pcVar7 = pcVar8;
                  break;
                }
                *pcVar7 = '\\';
                pcVar7[1] = cVar6;
                pcVar8 = pcVar7 + 2;
              }
              cVar6 = pcVar1[2];
              nextarg = pcVar1 + 2;
              pcVar7 = pcVar8;
            }
            else {
              nextarg = pcVar1;
              if (cVar6 == ':') {
                if (pcVar1[1] == '\0') {
                  pcVar5 = (char *)0x0;
                }
                else {
                  pcVar5 = strdup(pcVar1 + 1);
                }
                break;
              }
            }
          } while (cVar6 != '\0');
        }
        *pcVar7 = '\0';
        goto LAB_00112650;
      }
      goto LAB_0011264a;
    }
    pcVar4 = strdup(nextarg);
  }
  pcVar5 = (char *)0x0;
LAB_00112650:
  free(*file);
  *file = pcVar4;
  if (pcVar5 != (char *)0x0) {
    free(*password);
    *password = pcVar5;
  }
  return;
}

Assistant:

static void
GetFileAndPassword(const char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  if(nextarg) {
    parse_cert_parameter(nextarg, &certname, &passphrase);
    free(*file);
    *file = certname;
    if(passphrase) {
      free(*password);
      *password = passphrase;
    }
  }
}